

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# propname.cpp
# Opt level: O0

int32_t getEBCDICPropertyNameChar(char *name)

{
  char c_00;
  byte bVar1;
  int iVar2;
  bool bVar3;
  int local_1c;
  char c;
  int32_t i;
  char *name_local;
  
  local_1c = 0;
  do {
    iVar2 = local_1c + 1;
    c_00 = name[local_1c];
    bVar3 = true;
    if (((((c_00 != '`') && (bVar3 = true, c_00 != 'm')) && (bVar3 = true, c_00 != '@')) &&
        ((bVar3 = true, c_00 != '\x05' && (bVar3 = true, c_00 != '\x15')))) &&
       ((bVar3 = true, c_00 != '%' && ((bVar3 = true, c_00 != '\v' && (bVar3 = true, c_00 != '\f')))
        ))) {
      bVar3 = c_00 == '\r';
    }
    local_1c = iVar2;
  } while (bVar3);
  if (c_00 == '\0') {
    name_local._4_4_ = iVar2 * 0x100;
  }
  else {
    bVar1 = uprv_ebcdictolower_63(c_00);
    name_local._4_4_ = iVar2 * 0x100 | (uint)bVar1;
  }
  return name_local._4_4_;
}

Assistant:

static inline int32_t
getEBCDICPropertyNameChar(const char *name) {
    int32_t i;
    char c;

    /* Ignore delimiters '-', '_', and EBCDIC White_Space */
    for(i=0;
        (c=name[i++])==0x60 || c==0x6d ||
        c==0x40 || c==0x05 || c==0x15 || c==0x25 || c==0x0b || c==0x0c || c==0x0d;
    ) {}

    if(c!=0) {
        return (i<<8)|(uint8_t)uprv_ebcdictolower((char)c);
    } else {
        return i<<8;
    }
}